

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void player_fix_scramble(player *p)

{
  uint32_t *puVar1;
  ushort uVar2;
  long lVar3;
  int new_max [5];
  int new_cur [5];
  int local_38 [8];
  int aiStack_18 [6];
  
  lVar3 = -5;
  do {
    uVar2 = p->stat_map[lVar3 + 5];
    if (4 < uVar2) {
      __assert_fail("p->stat_map[i] >= 0 && p->stat_map[i] < STAT_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-util.c"
                    ,0x1a0,"void player_fix_scramble(struct player *)");
    }
    aiStack_18[uVar2] = (int)p->stat_map[lVar3];
    local_38[uVar2] = (int)p->stat_cur[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  lVar3 = 0;
  do {
    p->stat_cur[lVar3] = (int16_t)aiStack_18[lVar3];
    p->stat_max[lVar3] = (int16_t)local_38[lVar3];
    p->stat_map[lVar3] = (int16_t)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  puVar1 = &p->upkeep->update;
  *puVar1 = *puVar1 | 1;
  return;
}

Assistant:

void player_fix_scramble(struct player *p)
{
	/* Figure out what stats should be */
	int new_cur[STAT_MAX];
	int new_max[STAT_MAX];
	int i;

	for (i = 0; i < STAT_MAX; ++i) {
		assert(p->stat_map[i] >= 0 && p->stat_map[i] < STAT_MAX);
		new_cur[p->stat_map[i]] = p->stat_cur[i];
		new_max[p->stat_map[i]] = p->stat_max[i];
	}

	/* Apply new stats and reset stat_map */
	for (i = 0; i < STAT_MAX; ++i) {
		p->stat_cur[i] = new_cur[i];
		p->stat_max[i] = new_max[i];
		p->stat_map[i] = i;
	}

	/* Mark what else needs to be updated */
	p->upkeep->update |= (PU_BONUS);
}